

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void forbody(LexState *ls,int base,int line,int nvars,int isnum)

{
  FuncState *fs;
  int list;
  int list_00;
  BlockCnt bl;
  
  fs = ls->fs;
  adjustlocalvars(ls,3);
  checknext(ls,0x103);
  if (isnum == 0) {
    list = luaK_jump(fs);
  }
  else {
    list = luaK_codeABx(fs,OP_FORPREP,base,0x1fffe);
  }
  bl.breaklist = -1;
  bl.isbreakable = '\0';
  bl.nactvar = fs->nactvar;
  bl.upval = '\0';
  bl.previous = fs->bl;
  fs->bl = &bl;
  adjustlocalvars(ls,nvars);
  luaK_reserveregs(fs,nvars);
  block(ls);
  leaveblock(fs);
  luaK_patchtohere(fs,list);
  if (isnum == 0) {
    list_00 = luaK_codeABC(fs,OP_TFORLOOP,base,0,nvars);
  }
  else {
    list_00 = luaK_codeABx(fs,OP_FORLOOP,base,0x1fffe);
  }
  fs->f->lineinfo[(long)fs->pc + -1] = line;
  if (isnum == 0) {
    list_00 = luaK_jump(fs);
  }
  luaK_patchlist(fs,list_00,list + 1);
  return;
}

Assistant:

static void forbody(LexState*ls,int base,int line,int nvars,int isnum){
BlockCnt bl;
FuncState*fs=ls->fs;
int prep,endfor;
adjustlocalvars(ls,3);
checknext(ls,TK_DO);
prep=isnum?luaK_codeAsBx(fs,OP_FORPREP,base,(-1)):luaK_jump(fs);
enterblock(fs,&bl,0);
adjustlocalvars(ls,nvars);
luaK_reserveregs(fs,nvars);
block(ls);
leaveblock(fs);
luaK_patchtohere(fs,prep);
endfor=(isnum)?luaK_codeAsBx(fs,OP_FORLOOP,base,(-1)):
luaK_codeABC(fs,OP_TFORLOOP,base,0,nvars);
luaK_fixline(fs,line);
luaK_patchlist(fs,(isnum?endfor:luaK_jump(fs)),prep+1);
}